

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O3

Annotation * __thiscall soul::Annotation::operator=(Annotation *this,Annotation *other)

{
  _Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  __x;
  vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *in_RAX;
  vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *this_00;
  pointer __p;
  _Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  local_28;
  
  __x._M_head_impl =
       (other->properties)._M_t.
       super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       .
       super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
       ._M_head_impl;
  local_28._M_head_impl = in_RAX;
  if (__x._M_head_impl !=
      (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0) {
    this_00 = (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)
              operator_new(0x18);
    std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>::vector
              (this_00,__x._M_head_impl);
    local_28._M_head_impl =
         (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0;
    std::
    __uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
             *)this,this_00);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   *)&local_28);
  }
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
  operator=(&(this->dictionary).strings,&(other->dictionary).strings);
  (this->dictionary).nextIndex = (other->dictionary).nextIndex;
  return this;
}

Assistant:

Annotation& Annotation::operator= (const Annotation& other)
{
    if (other.properties != nullptr)
        properties = std::make_unique<std::vector<Property>> (*other.properties);

    dictionary = other.dictionary;
    return *this;
}